

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O3

SinkResultType __thiscall
duckdb::PipelineExecutor::Sink(PipelineExecutor *this,DataChunk *chunk,OperatorSinkInput *input)

{
  Pipeline *pPVar1;
  PhysicalOperator *pPVar2;
  int iVar3;
  
  pPVar1 = this->pipeline;
  optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&pPVar1->sink);
  pPVar2 = (pPVar1->sink).ptr;
  iVar3 = (*pPVar2->_vptr_PhysicalOperator[0x1a])(pPVar2,&this->context,chunk,input);
  return (SinkResultType)iVar3;
}

Assistant:

SinkResultType PipelineExecutor::Sink(DataChunk &chunk, OperatorSinkInput &input) {
	//! Testing feature to enable async sink on every operator
#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (debug_blocked_sink_count < debug_blocked_target_count) {
		debug_blocked_sink_count++;

		auto &callback_state = input.interrupt_state;
		std::thread rewake_thread([callback_state] {
			std::this_thread::sleep_for(std::chrono::milliseconds(1));
			callback_state.Callback();
		});
		rewake_thread.detach();

		return SinkResultType::BLOCKED;
	}
#endif
	return pipeline.sink->Sink(context, chunk, input);
}